

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_module *psVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Mem *pMem;
  i64 iVar5;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *p_Var6;
  sqlite3_vtab_cursor *psVar7;
  Fts5Table *pTab;
  sqlite3_vtab_cursor pStmt;
  long in_FS_OFFSET;
  int rc;
  sqlite3_vtab_cursor local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  local_48.pVtab = (sqlite3_vtab *)0x0;
  if (*(int *)&pVTab[2].field_0xc != 0) {
    pcVar4 = sqlite3_mprintf("recursive definition for %s.%s",*(undefined8 *)&pVTab[1].nRef,
                             pVTab[1].pModule);
    pVTab->zErrMsg = pcVar4;
    iVar2 = 1;
    goto LAB_001f418f;
  }
  psVar1 = pVTab[1].pModule;
  pcVar4 = sqlite3Fts5Mprintf(&local_3c,"SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH \'*id\'",
                              psVar1,*(undefined8 *)&pVTab[1].nRef,psVar1,psVar1);
  iVar2 = local_3c;
  if (pcVar4 != (char *)0x0) {
    iVar2 = sqlite3LockAndPrepare
                      ((sqlite3 *)pVTab[1].zErrMsg,pcVar4,-1,0x80,(Vdbe *)0x0,
                       (sqlite3_stmt **)&local_48,(char **)0x0);
    local_3c = iVar2;
    sqlite3_free(pcVar4);
  }
  pStmt.pVtab = local_48.pVtab;
  if (iVar2 == 1) {
    local_3c = 0;
    iVar2 = 0;
  }
  *(undefined4 *)&pVTab[2].field_0xc = 1;
  if ((local_48.pVtab == (sqlite3_vtab *)0x0) ||
     (iVar3 = sqlite3_step((sqlite3_stmt *)local_48.pVtab), iVar3 != 100)) {
    pTab = (Fts5Table *)0x0;
  }
  else {
    pTab = (Fts5Table *)0x0;
    pMem = columnMem((sqlite3_stmt *)pStmt.pVtab,0);
    iVar5 = sqlite3VdbeIntValue(pMem);
    columnMallocFailure((sqlite3_stmt *)pStmt.pVtab);
    p_Var6 = (pVTab[2].pModule)->xColumn;
    if (p_Var6 != (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)0x0) {
      pTab = (Fts5Table *)0x0;
      do {
        if (*(long *)(p_Var6 + 0x18) == iVar5) {
          pTab = *(Fts5Table **)p_Var6;
          break;
        }
        p_Var6 = *(_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **)(p_Var6 + 8);
      } while (p_Var6 != (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)0x0);
    }
  }
  *(undefined4 *)&pVTab[2].field_0xc = 0;
  if (iVar2 == 0) {
    if (pTab == (Fts5Table *)0x0) {
      local_3c = sqlite3_finalize((sqlite3_stmt *)pStmt.pVtab);
      if (local_3c == 0) {
        pStmt.pVtab = (sqlite3_vtab *)0x0;
        pcVar4 = sqlite3_mprintf("no such fts5 table: %s.%s",*(undefined8 *)&pVTab[1].nRef,
                                 pVTab[1].pModule);
        pVTab->zErrMsg = pcVar4;
        local_3c = 1;
      }
      else {
        pStmt.pVtab = (sqlite3_vtab *)0x0;
      }
      goto LAB_001f417e;
    }
    local_3c = sqlite3Fts5FlushToDisk(pTab);
    if ((local_3c != 0) ||
       (psVar7 = (sqlite3_vtab_cursor *)
                 sqlite3Fts5MallocZero(&local_3c,(long)pTab->pConfig->nCol * 0x10 + 0x80),
       psVar7 == (sqlite3_vtab_cursor *)0x0)) goto LAB_001f417e;
    psVar7[2].pVtab = &pTab->base;
    psVar7[1].pVtab = pStmt.pVtab;
    psVar7[9].pVtab = (sqlite3_vtab *)(psVar7 + 0x10);
    psVar7[10].pVtab = (sqlite3_vtab *)(psVar7 + (long)pTab->pConfig->nCol + 0x10);
  }
  else {
LAB_001f417e:
    sqlite3_finalize((sqlite3_stmt *)pStmt.pVtab);
    psVar7 = (sqlite3_vtab_cursor *)0x0;
  }
  *ppCsr = psVar7;
  iVar2 = local_3c;
LAB_001f418f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts5VocabOpenMethod(
  sqlite3_vtab *pVTab,
  sqlite3_vtab_cursor **ppCsr
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pVTab;
  Fts5Table *pFts5 = 0;
  Fts5VocabCursor *pCsr = 0;
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  char *zSql = 0;

  if( pTab->bBusy ){
    pVTab->zErrMsg = sqlite3_mprintf(
       "recursive definition for %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
    );
    return SQLITE_ERROR;
  }
  zSql = sqlite3Fts5Mprintf(&rc,
      "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH '*id'",
      pTab->zFts5Tbl, pTab->zFts5Db, pTab->zFts5Tbl, pTab->zFts5Tbl
  );
  if( zSql ){
    rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pStmt, 0);
  }
  sqlite3_free(zSql);
  assert( rc==SQLITE_OK || pStmt==0 );
  if( rc==SQLITE_ERROR ) rc = SQLITE_OK;

  pTab->bBusy = 1;
  if( pStmt && sqlite3_step(pStmt)==SQLITE_ROW ){
    i64 iId = sqlite3_column_int64(pStmt, 0);
    pFts5 = sqlite3Fts5TableFromCsrid(pTab->pGlobal, iId);
  }
  pTab->bBusy = 0;

  if( rc==SQLITE_OK ){
    if( pFts5==0 ){
      rc = sqlite3_finalize(pStmt);
      pStmt = 0;
      if( rc==SQLITE_OK ){
        pVTab->zErrMsg = sqlite3_mprintf(
            "no such fts5 table: %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
        );
        rc = SQLITE_ERROR;
      }
    }else{
      rc = sqlite3Fts5FlushToDisk(pFts5);
    }
  }

  if( rc==SQLITE_OK ){
    i64 nByte = pFts5->pConfig->nCol * sizeof(i64)*2 + sizeof(Fts5VocabCursor);
    pCsr = (Fts5VocabCursor*)sqlite3Fts5MallocZero(&rc, nByte);
  }

  if( pCsr ){
    pCsr->pFts5 = pFts5;
    pCsr->pStmt = pStmt;
    pCsr->aCnt = (i64*)&pCsr[1];
    pCsr->aDoc = &pCsr->aCnt[pFts5->pConfig->nCol];
  }else{
    sqlite3_finalize(pStmt);
  }

  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}